

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined4 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined8 uVar29;
  int *piVar36;
  pointer piVar37;
  int iVar38;
  undefined1 uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int k;
  int iVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  float *pfVar51;
  ulong __n;
  Mat *pMVar52;
  bool bVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g;
  long local_140;
  allocator_type local_131;
  ulong local_130;
  int local_128;
  int local_124;
  Mat *local_120;
  ulong local_118;
  ulong local_110;
  Mat local_108;
  long local_c0;
  long local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  Mat local_98;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  undefined4 uVar23;
  undefined3 uVar25;
  undefined2 uVar27;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined3 uVar32;
  undefined1 uVar33;
  undefined2 uVar34;
  undefined1 uVar35;
  
  uVar3 = bottom_blob->c;
  iVar47 = this->kernel_w;
  iVar45 = this->dilation_w;
  iVar46 = this->kernel_h;
  iVar40 = this->dilation_h;
  local_108.elemsize = bottom_blob->elemsize;
  local_108.data = bottom_blob->data;
  local_108.refcount = bottom_blob->refcount;
  local_108.elempack = bottom_blob->elempack;
  local_108.allocator = bottom_blob->allocator;
  local_108.dims = bottom_blob->dims;
  local_108.w = bottom_blob->w;
  local_108.h = bottom_blob->h;
  local_108.d = bottom_blob->d;
  local_108.cstep = bottom_blob->cstep;
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + 1;
    UNLOCK();
  }
  local_108.c = uVar3;
  if (local_108.elemsize != 1) {
    local_98.data = *(void **)opt;
    uVar5 = opt->openmp_blocktime;
    uVar6 = opt->use_winograd_convolution;
    uVar8 = opt->use_sgemm_convolution;
    uVar10 = opt->use_int8_inference;
    uVar12 = opt->use_vulkan_compute;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    local_98.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar13 = opt->vulkan_device_index;
    uVar14 = opt->use_reserved_1;
    uVar16 = opt->use_image_storage;
    uVar18 = opt->use_tensor_storage;
    uVar20 = opt->use_reserved_2;
    uVar19 = CONCAT11(uVar20,uVar18);
    uVar17 = CONCAT21(uVar19,uVar16);
    uVar15 = CONCAT31(uVar17,uVar14);
    uVar21 = opt->flush_denormals;
    uVar22 = opt->use_local_pool_allocator;
    uVar24 = opt->use_shader_local_memory;
    uVar26 = opt->use_cooperative_matrix;
    uVar28 = opt->use_winograd23_convolution;
    uVar27 = CONCAT11(uVar28,uVar26);
    uVar25 = CONCAT21(uVar27,uVar24);
    uVar23 = CONCAT31(uVar25,uVar22);
    uVar29._0_1_ = opt->use_winograd43_convolution;
    uVar29._1_1_ = opt->use_winograd63_convolution;
    uVar29._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar29._3_1_ = opt->use_fp16_uniform;
    uVar30 = opt->use_int8_uniform;
    uVar31 = opt->use_reserved_9;
    uVar33 = opt->use_reserved_10;
    uVar35 = opt->use_reserved_11;
    uVar34 = CONCAT11(uVar35,uVar33);
    uVar32 = CONCAT21(uVar34,uVar31);
    uVar29._4_4_ = CONCAT31(uVar32,uVar30);
    local_98.c = (int)uVar29;
    local_98.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_98.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_98.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_98.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_98.elempack = uVar5;
    local_98._28_4_ = uVar7;
    local_98.dims = uVar13;
    local_98.w = uVar15;
    local_98.h = uVar21;
    local_98.d = uVar23;
    local_98._60_4_ = uVar29._4_4_;
    quantize_to_int8(bottom_blob,&local_108,&this->bottom_blob_int8_scales,(Option *)&local_98);
    if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0)) {
      iVar41 = -100;
      goto LAB_0014fcd2;
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  make_padding(this,&local_108,&local_98,this->kernel_w,this->kernel_h,opt);
  iVar38 = local_98.w;
  iVar41 = -100;
  if ((local_98.data != (void *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
    uVar43 = (long)(~((iVar47 + -1) * iVar45) + local_98.w) / (long)this->stride_w;
    uVar49 = (long)(~((iVar46 + -1) * iVar40) + local_98.h) / (long)this->stride_h;
    uVar50 = uVar49 & 0xffffffff;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    local_120 = top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&local_b0,__n,&local_131);
    piVar37 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar52 = local_120;
    iVar47 = this->kernel_h;
    if (0 < iVar47) {
      iVar45 = this->dilation_h;
      iVar46 = this->kernel_w;
      iVar40 = this->dilation_w * iVar46;
      iVar41 = 0;
      iVar42 = 0;
      iVar44 = 0;
      do {
        if (0 < iVar46) {
          lVar48 = 0;
          do {
            local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar41 + lVar48] = iVar44;
            iVar44 = iVar44 + this->dilation_w;
            iVar46 = this->kernel_w;
            lVar48 = lVar48 + 1;
          } while ((int)lVar48 < iVar46);
          iVar41 = iVar41 + (int)lVar48;
          iVar47 = this->kernel_h;
        }
        iVar44 = iVar44 + (iVar38 * iVar45 - iVar40);
        iVar42 = iVar42 + 1;
      } while (iVar42 < iVar47);
    }
    local_124 = this->int8_scale_term;
    local_110 = uVar43 & 0xffffffff;
    Mat::create(local_120,(int)uVar43 + 1,(int)uVar49 + 1,this->num_output,
                (ulong)(local_124 < 0x65) * 3 + 1,opt->blob_allocator);
    iVar41 = -100;
    if ((pMVar52->data != (void *)0x0) && ((long)pMVar52->c * pMVar52->cstep != 0)) {
      iVar47 = this->num_output;
      if (0 < iVar47) {
        local_128 = uVar3 * (int)__n;
        local_140 = 0;
        local_118 = uVar50;
        do {
          if (-1 < (int)uVar50) {
            pfVar51 = (float *)(pMVar52->cstep * local_140 * pMVar52->elemsize + (long)pMVar52->data
                               );
            local_c0 = (long)(local_128 * (int)local_140);
            local_130 = 0;
            do {
              if (-1 < (int)local_110) {
                local_b8 = (long)(int)local_130;
                iVar47 = 0;
                do {
                  fVar56 = 0.0;
                  fVar54 = 0.0;
                  if (0 < (int)uVar3) {
                    lVar48 = (long)(this->weight_data).data + local_c0;
                    uVar43 = 0;
                    iVar45 = 0;
                    do {
                      if (0 < (int)__n) {
                        uVar49 = 0;
                        do {
                          iVar45 = iVar45 + (int)*(char *)(lVar48 + uVar49) *
                                            (int)*(char *)((long)local_98.data +
                                                          (long)piVar37[uVar49] +
                                                          local_98.cstep *
                                                          CONCAT44(local_98.elemsize._4_4_,
                                                                   (undefined4)local_98.elemsize) *
                                                          uVar43 + (long)iVar47 *
                                                                   (long)this->stride_w +
                                                                   (long)local_98.w *
                                                                   CONCAT44(local_98.elemsize._4_4_,
                                                                            (undefined4)
                                                                            local_98.elemsize) *
                                                                   this->stride_h * local_b8);
                          uVar49 = uVar49 + 1;
                        } while ((__n & 0xffffffff) != uVar49);
                      }
                      lVar48 = lVar48 + __n;
                      uVar43 = uVar43 + 1;
                    } while (uVar43 != uVar3);
                    fVar54 = (float)iVar45;
                  }
                  fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + local_140 * 4);
                  if (fVar1 != 0.0) {
                    fVar56 = 1.0 / (fVar1 * *(this->bottom_blob_int8_scales).data);
                  }
                  fVar56 = fVar56 * fVar54;
                  if (this->bias_term != 0) {
                    fVar56 = fVar56 + *(float *)((long)(this->bias_data).data + local_140 * 4);
                  }
                  fVar54 = fVar56;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar56 <= 0.0) {
                      fVar54 = 0.0;
                    }
                    break;
                  case 2:
                    fVar54 = (float)(~-(uint)(0.0 < fVar56) & *(this->activation_params).data |
                                    -(uint)(0.0 < fVar56) & 0x3f800000) * fVar56;
                    break;
                  case 3:
                    pfVar4 = (float *)(this->activation_params).data;
                    fVar54 = *pfVar4;
                    if (fVar56 <= fVar54) {
                      fVar56 = fVar54;
                    }
                    fVar54 = pfVar4[1];
                    if (fVar56 <= fVar54) {
                      fVar54 = fVar56;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar56) {
                      fVar56 = 88.37626;
                    }
                    fVar54 = expf((float)(-(uint)(fVar56 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar56 < -88.37626) & (uint)-fVar56));
                    fVar54 = 1.0 / (fVar54 + 1.0);
                    break;
                  case 5:
                    uStack_44 = 0;
                    uStack_40 = 0;
                    uStack_3c = 0;
                    local_48 = fVar56;
                    fVar54 = expf(fVar56);
                    fVar54 = logf(fVar54 + 1.0);
                    fVar54 = tanhf(fVar54);
                    fVar54 = fVar54 * local_48;
                    break;
                  case 6:
                    pfVar4 = (float *)(this->activation_params).data;
                    fVar1 = *pfVar4;
                    fVar2 = pfVar4[1];
                    fVar55 = -fVar2 / fVar1;
                    fVar54 = 0.0;
                    if ((fVar55 <= fVar56) && (fVar54 = fVar56, fVar56 <= fVar55 + 1.0 / fVar1)) {
                      fVar54 = (fVar1 * fVar56 + fVar2) * fVar56;
                    }
                  }
                  if (local_124 < 0x65) {
                    *pfVar51 = fVar54;
                    lVar48 = 4;
                  }
                  else {
                    fVar54 = roundf(fVar54 * *(this->top_blob_int8_scales).data);
                    iVar45 = (int)fVar54;
                    if (iVar45 < -0x7e) {
                      iVar45 = -0x7f;
                    }
                    uVar39 = (undefined1)iVar45;
                    if (0x7e < iVar45) {
                      uVar39 = 0x7f;
                    }
                    *(undefined1 *)pfVar51 = uVar39;
                    lVar48 = 1;
                  }
                  pfVar51 = (float *)((long)pfVar51 + lVar48);
                  bVar53 = iVar47 != (int)local_110;
                  iVar47 = iVar47 + 1;
                } while (bVar53);
              }
              iVar47 = (int)local_130;
              local_130 = (ulong)(iVar47 + 1);
            } while (iVar47 != (int)local_118);
            iVar47 = this->num_output;
            uVar50 = local_118;
            pMVar52 = local_120;
          }
          local_140 = local_140 + 1;
        } while (local_140 < iVar47);
      }
      iVar41 = 0;
    }
    if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar36 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar36 != (int *)0x0) {
    LOCK();
    *piVar36 = *piVar36 + -1;
    UNLOCK();
    if (*piVar36 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0014fcd2:
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + -1;
    UNLOCK();
    if (*local_108.refcount == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar41;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
        if (bottom_blob_unbordered.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}